

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::CollationIterator::appendNumericCEs
          (CollationIterator *this,uint32_t ce32,UBool forward,UErrorCode *errorCode)

{
  uint uVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  CharString digits;
  CharString local_68;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_68.buffer);
  local_68.len = 0;
  *local_68.buffer.ptr = '\0';
  if (forward == '\0') {
    do {
      CharString::append(&local_68,(byte)(ce32 >> 8) & 0xf,errorCode);
      iVar4 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
      if (iVar4 < 0) goto LAB_00231011;
      ce32 = CollationData::getCE32(this->data,iVar4);
      if (ce32 == 0xc0) {
        ce32 = CollationData::getCE32(this->data->base,iVar4);
      }
    } while ((ce32 & 0xcf) == 0xca);
    (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
LAB_00231011:
    pcVar6 = local_68.buffer.ptr + (long)local_68.len + -1;
    pcVar3 = local_68.buffer.ptr;
    if (local_68.buffer.ptr < pcVar6) {
      do {
        pcVar5 = pcVar3 + 1;
        cVar2 = *pcVar3;
        *pcVar3 = *pcVar6;
        *pcVar6 = cVar2;
        pcVar6 = pcVar6 + -1;
        pcVar3 = pcVar5;
      } while (pcVar5 < pcVar6);
    }
  }
  else {
    while( true ) {
      CharString::append(&local_68,(byte)(ce32 >> 8) & 0xf,errorCode);
      if ((this->numCpFwd == 0) ||
         (iVar4 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode), iVar4 < 0))
      goto LAB_00231056;
      ce32 = CollationData::getCE32(this->data,iVar4);
      if (ce32 == 0xc0) {
        ce32 = CollationData::getCE32(this->data->base,iVar4);
      }
      if ((ce32 & 0xcf) != 0xca) break;
      if (0 < this->numCpFwd) {
        this->numCpFwd = this->numCpFwd + -1;
      }
    }
    (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
  }
LAB_00231056:
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar8 = 0;
    do {
      uVar1 = local_68.len - 1;
      if ((int)uVar8 < (int)uVar1) {
        uVar8 = (ulong)(int)uVar8;
        do {
          if (local_68.buffer.ptr[uVar8] != '\0') goto LAB_0023108d;
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)(int)uVar1);
        uVar8 = (ulong)uVar1;
      }
LAB_0023108d:
      iVar7 = (int)uVar8;
      iVar4 = local_68.len - iVar7;
      if (0xfd < local_68.len - iVar7) {
        iVar4 = 0xfe;
      }
      appendNumericSegmentCEs(this,local_68.buffer.ptr + iVar7,iVar4,errorCode);
    } while ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
            (uVar8 = (ulong)(uint)(iVar7 + iVar4), iVar7 + iVar4 < local_68.len));
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_68.buffer);
  return;
}

Assistant:

void
CollationIterator::appendNumericCEs(uint32_t ce32, UBool forward, UErrorCode &errorCode) {
    // Collect digits.
    CharString digits;
    if(forward) {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            if(numCpFwd == 0) { break; }
            UChar32 c = nextCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                backwardNumCodePoints(1, errorCode);
                break;
            }
            if(numCpFwd > 0) { --numCpFwd; }
        }
    } else {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            UChar32 c = previousCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                forwardNumCodePoints(1, errorCode);
                break;
            }
        }
        // Reverse the digit string.
        char *p = digits.data();
        char *q = p + digits.length() - 1;
        while(p < q) {
            char digit = *p;
            *p++ = *q;
            *q-- = digit;
        }
    }
    if(U_FAILURE(errorCode)) { return; }
    int32_t pos = 0;
    do {
        // Skip leading zeros.
        while(pos < (digits.length() - 1) && digits[pos] == 0) { ++pos; }
        // Write a sequence of CEs for at most 254 digits at a time.
        int32_t segmentLength = digits.length() - pos;
        if(segmentLength > 254) { segmentLength = 254; }
        appendNumericSegmentCEs(digits.data() + pos, segmentLength, errorCode);
        pos += segmentLength;
    } while(U_SUCCESS(errorCode) && pos < digits.length());
}